

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O3

void __thiscall DFsScript::DFsScript(DFsScript *this)

{
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_008900b0;
  memset(this->children,0,0x808);
  this->data = (char *)0x0;
  memset(this->sections,0,0x108);
  this->scriptnum = -1;
  this->len = 0;
  (this->parent).field_0.p = (DFsScript *)0x0;
  (this->trigger).field_0.p = (AActor *)0x0;
  this->lastiftrue = false;
  return;
}

Assistant:

DFsScript::DFsScript()
{
	int i;
	
	for(i=0; i<SECTIONSLOTS; i++) sections[i] = NULL;
	for(i=0; i<VARIABLESLOTS; i++) variables[i] = NULL;
	for(i=0; i<MAXSCRIPTS; i++)	children[i] = NULL;

	data = NULL;
	scriptnum = -1;
	len = 0;
	parent = NULL;
	trigger = NULL;
	lastiftrue = false;
}